

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O2

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>::
index_key_value<jsoncons::byte_string_arg_t_const&,jsoncons::byte_string_view_const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
           *this,key_type *Name,int64_t Index,byte_string_arg_t *args,byte_string_view *args_1,
          semantic_tag *args_2)

{
  undefined1 local_21;
  
  std::__cxx11::string::string((string *)this,(string *)Name);
  *(int64_t *)(this + 0x20) = Index;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
  basic_json<jsoncons::byte_string_view>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             (this + 0x28),args_1,*args_2,&local_21,0);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }